

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_writer.hpp
# Opt level: O2

void __thiscall
BinaryWriter::emplace_chars<char(*)(char)>
          (BinaryWriter *this,size_t count,char *data,_func_char_char *transform)

{
  char cVar1;
  uchar uVar2;
  size_t i;
  size_t sVar3;
  
  if (this->offset + count <= this->max_offset) {
    for (sVar3 = 0; count != sVar3; sVar3 = sVar3 + 1) {
      cVar1 = *data;
      if (cVar1 == '\0') {
        uVar2 = '\0';
      }
      else {
        data = data + 1;
        uVar2 = (*transform)(cVar1);
      }
      (this->bytecode)._M_t.
      super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>._M_t.
      super__Tuple_impl<0UL,_unsigned_char_*,_std::default_delete<unsigned_char[]>_>.
      super__Head_base<0UL,_unsigned_char_*,_false>._M_head_impl[sVar3 + this->offset] = uVar2;
    }
    this->offset = this->offset + count;
    return;
  }
  __assert_fail("this->offset + count <= max_offset",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/AndroidModLoader[P]gta3sc/src/binary_writer.hpp"
                ,0x67,
                "void BinaryWriter::emplace_chars(size_t, const char *, FuncT) [FuncT = char (*)(char)]"
               );
}

Assistant:

void emplace_chars(size_t count, const char* data, FuncT transform)
    {
        assert(this->offset + count <= max_offset);
        for(size_t i = 0; i < count; ++i)
        {
            if(*data == 0)
                this->bytecode[offset+i] = 0;
            else
                this->bytecode[offset+i] = transform(*data++);
        }
        this->offset += count;
    }